

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Action<BasicTestLinearExprBuilder<1>_(int)> * __thiscall
testing::internal::TypedExpectation<BasicTestLinearExprBuilder<1>_(int)>::GetCurrentAction
          (TypedExpectation<BasicTestLinearExprBuilder<1>_(int)> *this,
          FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)> *mocker,ArgumentTuple *args)

{
  size_type sVar1;
  ostream *args_00;
  char *pcVar2;
  ostream *os;
  ostream *poVar3;
  const_reference ppvVar4;
  Action<BasicTestLinearExprBuilder<1>_(int)> *pAVar5;
  TypedExpectation<BasicTestLinearExprBuilder<1>_(int)> *in_RDI;
  stringstream ss;
  int action_count;
  int count;
  string *in_stack_fffffffffffffd78;
  ExpectationBase *in_stack_fffffffffffffd80;
  int iVar6;
  char *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined1 condition;
  MutexBase *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  ostream *in_stack_fffffffffffffdc8;
  ExpectationBase *in_stack_fffffffffffffdd0;
  FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)> *this_00;
  undefined4 in_stack_fffffffffffffdf4;
  LogSeverity severity;
  string local_200 [32];
  stringstream local_1e0 [16];
  FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)> local_1d0 [3];
  int local_58;
  allocator<char> local_41;
  string local_40 [36];
  int local_1c;
  
  condition = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38);
  MutexBase::AssertHeld(in_stack_fffffffffffffdb0);
  local_1c = ExpectationBase::call_count(in_stack_fffffffffffffd80);
  iVar6 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  severity = CONCAT13(0 < local_1c,(int3)in_stack_fffffffffffffdf4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator<char> *)in_stack_fffffffffffffdb0);
  Assert((bool)condition,in_stack_fffffffffffffd88,iVar6,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  sVar1 = std::vector<const_void_*,_std::allocator<const_void_*>_>::size
                    (&(in_RDI->super_ExpectationBase).untyped_actions_);
  local_58 = (int)sVar1;
  if (((0 < local_58) && (((in_RDI->super_ExpectationBase).repeated_action_specified_ & 1U) == 0))
     && (local_58 < local_1c)) {
    std::__cxx11::stringstream::stringstream(local_1e0);
    this_00 = (FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)> *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1e0) {
      this_00 = local_1d0;
    }
    ExpectationBase::DescribeLocationTo(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    args_00 = std::operator<<((ostream *)local_1d0,"Actions ran out in ");
    pcVar2 = ExpectationBase::source_text((ExpectationBase *)0x1dfce0);
    os = std::operator<<(args_00,pcVar2);
    poVar3 = std::operator<<(os,"...\n");
    poVar3 = std::operator<<(poVar3,"Called ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
    poVar3 = std::operator<<(poVar3," times, but only ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58);
    poVar3 = std::operator<<(poVar3," WillOnce()");
    pcVar2 = "s are";
    if (local_58 == 1) {
      pcVar2 = " is";
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3," specified - ");
    FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)>::DescribeDefaultActionTo
              (this_00,(ArgumentTuple *)args_00,os);
    iVar6 = (int)((ulong)this_00 >> 0x20);
    std::__cxx11::stringstream::str();
    Log(severity,(string *)in_RDI,iVar6);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::stringstream::~stringstream(local_1e0);
  }
  if (local_58 < local_1c) {
    pAVar5 = repeated_action(in_RDI);
  }
  else {
    ppvVar4 = std::vector<const_void_*,_std::allocator<const_void_*>_>::operator[]
                        (&(in_RDI->super_ExpectationBase).untyped_actions_,(long)(local_1c + -1));
    pAVar5 = (Action<BasicTestLinearExprBuilder<1>_(int)> *)*ppvVar4;
  }
  return pAVar5;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = call_count();
    Assert(count >= 1, __FILE__, __LINE__,
           "call_count() is <= 0 when GetCurrentAction() is "
           "called - this should never happen.");

    const int action_count = static_cast<int>(untyped_actions_.size());
    if (action_count > 0 && !repeated_action_specified_ &&
        count > action_count) {
      // If there is at least one WillOnce() and no WillRepeatedly(),
      // we warn the user when the WillOnce() clauses ran out.
      ::std::stringstream ss;
      DescribeLocationTo(&ss);
      ss << "Actions ran out in " << source_text() << "...\n"
         << "Called " << count << " times, but only "
         << action_count << " WillOnce()"
         << (action_count == 1 ? " is" : "s are") << " specified - ";
      mocker->DescribeDefaultActionTo(args, &ss);
      Log(kWarning, ss.str(), 1);
    }

    return count <= action_count ?
        *static_cast<const Action<F>*>(untyped_actions_[count - 1]) :
        repeated_action();
  }